

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20250127::Cord::CopyToArraySlowPath(Cord *this,Nonnull<char_*> dst)

{
  bool bVar1;
  Nullable<absl::cord_internal::CordRep_*> rep;
  reference rVar2;
  string_view fragment;
  ChunkIterator __begin2;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  ChunkIterator local_b0;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
    local_c8._M_len = 0;
    local_c8._M_str = (char *)0x0;
    rep = InlineRep::tree(&this->contents_);
    bVar1 = GetFlatAux(rep,&local_c8);
    if (bVar1) {
      memcpy(dst,local_c8._M_str,local_c8._M_len);
    }
    else {
      ChunkIterator::ChunkIterator(&local_b0,this);
      while (local_b0.bytes_remaining_ != 0) {
        rVar2 = ChunkIterator::operator*(&local_b0);
        memcpy(dst,rVar2._M_str,rVar2._M_len);
        dst = dst + rVar2._M_len;
        ChunkIterator::operator++(&local_b0);
      }
    }
    return;
  }
  __assert_fail("contents_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x433,"void absl::Cord::CopyToArraySlowPath(absl::Nonnull<char *>) const");
}

Assistant:

void Cord::CopyToArraySlowPath(absl::Nonnull<char*> dst) const {
  assert(contents_.is_tree());
  absl::string_view fragment;
  if (GetFlatAux(contents_.tree(), &fragment)) {
    memcpy(dst, fragment.data(), fragment.size());
    return;
  }
  for (absl::string_view chunk : Chunks()) {
    memcpy(dst, chunk.data(), chunk.size());
    dst += chunk.size();
  }
}